

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

int mbedtls_sha512_finish_ret(mbedtls_sha512_context *ctx,uchar *output)

{
  uchar *data;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = (uint)ctx->total[0] & 0x7f;
  data = ctx->buffer;
  ctx->buffer[uVar3] = 0x80;
  if (uVar3 < 0x70) {
    memset(ctx->buffer + (ulong)uVar3 + 1,0,(ulong)(0x6f - uVar3));
  }
  else {
    memset(ctx->buffer + (ulong)uVar3 + 1,0,(ulong)(uVar3 ^ 0x7f));
    mbedtls_internal_sha512_process(ctx,data);
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    ctx->buffer[8] = '\0';
    ctx->buffer[9] = '\0';
    ctx->buffer[10] = '\0';
    ctx->buffer[0xb] = '\0';
    ctx->buffer[0xc] = '\0';
    ctx->buffer[0xd] = '\0';
    ctx->buffer[0xe] = '\0';
    ctx->buffer[0xf] = '\0';
    ctx->buffer[0x10] = '\0';
    ctx->buffer[0x11] = '\0';
    ctx->buffer[0x12] = '\0';
    ctx->buffer[0x13] = '\0';
    ctx->buffer[0x14] = '\0';
    ctx->buffer[0x15] = '\0';
    ctx->buffer[0x16] = '\0';
    ctx->buffer[0x17] = '\0';
    ctx->buffer[0x18] = '\0';
    ctx->buffer[0x19] = '\0';
    ctx->buffer[0x1a] = '\0';
    ctx->buffer[0x1b] = '\0';
    ctx->buffer[0x1c] = '\0';
    ctx->buffer[0x1d] = '\0';
    ctx->buffer[0x1e] = '\0';
    ctx->buffer[0x1f] = '\0';
    ctx->buffer[0x20] = '\0';
    ctx->buffer[0x21] = '\0';
    ctx->buffer[0x22] = '\0';
    ctx->buffer[0x23] = '\0';
    ctx->buffer[0x24] = '\0';
    ctx->buffer[0x25] = '\0';
    ctx->buffer[0x26] = '\0';
    ctx->buffer[0x27] = '\0';
    ctx->buffer[0x28] = '\0';
    ctx->buffer[0x29] = '\0';
    ctx->buffer[0x2a] = '\0';
    ctx->buffer[0x2b] = '\0';
    ctx->buffer[0x2c] = '\0';
    ctx->buffer[0x2d] = '\0';
    ctx->buffer[0x2e] = '\0';
    ctx->buffer[0x2f] = '\0';
    ctx->buffer[0x30] = '\0';
    ctx->buffer[0x31] = '\0';
    ctx->buffer[0x32] = '\0';
    ctx->buffer[0x33] = '\0';
    ctx->buffer[0x34] = '\0';
    ctx->buffer[0x35] = '\0';
    ctx->buffer[0x36] = '\0';
    ctx->buffer[0x37] = '\0';
    ctx->buffer[0x38] = '\0';
    ctx->buffer[0x39] = '\0';
    ctx->buffer[0x3a] = '\0';
    ctx->buffer[0x3b] = '\0';
    ctx->buffer[0x3c] = '\0';
    ctx->buffer[0x3d] = '\0';
    ctx->buffer[0x3e] = '\0';
    ctx->buffer[0x3f] = '\0';
    ctx->buffer[0x40] = '\0';
    ctx->buffer[0x41] = '\0';
    ctx->buffer[0x42] = '\0';
    ctx->buffer[0x43] = '\0';
    ctx->buffer[0x44] = '\0';
    ctx->buffer[0x45] = '\0';
    ctx->buffer[0x46] = '\0';
    ctx->buffer[0x47] = '\0';
    ctx->buffer[0x48] = '\0';
    ctx->buffer[0x49] = '\0';
    ctx->buffer[0x4a] = '\0';
    ctx->buffer[0x4b] = '\0';
    ctx->buffer[0x4c] = '\0';
    ctx->buffer[0x4d] = '\0';
    ctx->buffer[0x4e] = '\0';
    ctx->buffer[0x4f] = '\0';
    ctx->buffer[0x50] = '\0';
    ctx->buffer[0x51] = '\0';
    ctx->buffer[0x52] = '\0';
    ctx->buffer[0x53] = '\0';
    ctx->buffer[0x54] = '\0';
    ctx->buffer[0x55] = '\0';
    ctx->buffer[0x56] = '\0';
    ctx->buffer[0x57] = '\0';
    ctx->buffer[0x58] = '\0';
    ctx->buffer[0x59] = '\0';
    ctx->buffer[0x5a] = '\0';
    ctx->buffer[0x5b] = '\0';
    ctx->buffer[0x5c] = '\0';
    ctx->buffer[0x5d] = '\0';
    ctx->buffer[0x5e] = '\0';
    ctx->buffer[0x5f] = '\0';
    ctx->buffer[0x60] = '\0';
    ctx->buffer[0x61] = '\0';
    ctx->buffer[0x62] = '\0';
    ctx->buffer[99] = '\0';
    ctx->buffer[100] = '\0';
    ctx->buffer[0x65] = '\0';
    ctx->buffer[0x66] = '\0';
    ctx->buffer[0x67] = '\0';
    ctx->buffer[0x68] = '\0';
    ctx->buffer[0x69] = '\0';
    ctx->buffer[0x6a] = '\0';
    ctx->buffer[0x6b] = '\0';
    ctx->buffer[0x6c] = '\0';
    ctx->buffer[0x6d] = '\0';
    ctx->buffer[0x6e] = '\0';
    ctx->buffer[0x6f] = '\0';
  }
  uVar1 = ctx->total[0];
  lVar2 = ctx->total[1] << 3;
  ctx->buffer[0x70] = (uchar)((ulong)lVar2 >> 0x38);
  ctx->buffer[0x71] = (uchar)((ulong)lVar2 >> 0x30);
  ctx->buffer[0x72] = (uchar)((ulong)lVar2 >> 0x28);
  ctx->buffer[0x73] = (uchar)((ulong)lVar2 >> 0x20);
  ctx->buffer[0x74] = (uchar)((ulong)lVar2 >> 0x18);
  ctx->buffer[0x75] = (uchar)((ulong)lVar2 >> 0x10);
  ctx->buffer[0x76] = (uchar)((ulong)lVar2 >> 8);
  ctx->buffer[0x77] = (byte)lVar2 | (byte)(uVar1 >> 0x3d);
  ctx->buffer[0x78] = (uchar)(uVar1 >> 0x35);
  ctx->buffer[0x79] = (uchar)(uVar1 >> 0x2d);
  ctx->buffer[0x7a] = (uchar)(uVar1 >> 0x25);
  ctx->buffer[0x7b] = (uchar)(uVar1 >> 0x1d);
  ctx->buffer[0x7c] = (uchar)(uVar1 >> 0x15);
  ctx->buffer[0x7d] = (uchar)(uVar1 >> 0xd);
  ctx->buffer[0x7e] = (uchar)(uVar1 >> 5);
  ctx->buffer[0x7f] = (char)uVar1 * '\b';
  mbedtls_internal_sha512_process(ctx,data);
  *output = *(uchar *)((long)ctx->state + 7);
  output[1] = *(uchar *)((long)ctx->state + 6);
  output[2] = *(uchar *)((long)ctx->state + 5);
  output[3] = *(uchar *)((long)ctx->state + 4);
  output[4] = *(uchar *)((long)ctx->state + 3);
  output[5] = *(uchar *)((long)ctx->state + 2);
  output[6] = *(uchar *)((long)ctx->state + 1);
  output[7] = (uchar)ctx->state[0];
  output[8] = *(uchar *)((long)ctx->state + 0xf);
  output[9] = *(uchar *)((long)ctx->state + 0xe);
  output[10] = *(uchar *)((long)ctx->state + 0xd);
  output[0xb] = *(uchar *)((long)ctx->state + 0xc);
  output[0xc] = *(uchar *)((long)ctx->state + 0xb);
  output[0xd] = *(uchar *)((long)ctx->state + 10);
  output[0xe] = *(uchar *)((long)ctx->state + 9);
  output[0xf] = (uchar)ctx->state[1];
  output[0x10] = *(uchar *)((long)ctx->state + 0x17);
  output[0x11] = *(uchar *)((long)ctx->state + 0x16);
  output[0x12] = *(uchar *)((long)ctx->state + 0x15);
  output[0x13] = *(uchar *)((long)ctx->state + 0x14);
  output[0x14] = *(uchar *)((long)ctx->state + 0x13);
  output[0x15] = *(uchar *)((long)ctx->state + 0x12);
  output[0x16] = *(uchar *)((long)ctx->state + 0x11);
  output[0x17] = (uchar)ctx->state[2];
  output[0x18] = *(uchar *)((long)ctx->state + 0x1f);
  output[0x19] = *(uchar *)((long)ctx->state + 0x1e);
  output[0x1a] = *(uchar *)((long)ctx->state + 0x1d);
  output[0x1b] = *(uchar *)((long)ctx->state + 0x1c);
  output[0x1c] = *(uchar *)((long)ctx->state + 0x1b);
  output[0x1d] = *(uchar *)((long)ctx->state + 0x1a);
  output[0x1e] = *(uchar *)((long)ctx->state + 0x19);
  output[0x1f] = (uchar)ctx->state[3];
  output[0x20] = *(uchar *)((long)ctx->state + 0x27);
  output[0x21] = *(uchar *)((long)ctx->state + 0x26);
  output[0x22] = *(uchar *)((long)ctx->state + 0x25);
  output[0x23] = *(uchar *)((long)ctx->state + 0x24);
  output[0x24] = *(uchar *)((long)ctx->state + 0x23);
  output[0x25] = *(uchar *)((long)ctx->state + 0x22);
  output[0x26] = *(uchar *)((long)ctx->state + 0x21);
  output[0x27] = (uchar)ctx->state[4];
  output[0x28] = *(uchar *)((long)ctx->state + 0x2f);
  output[0x29] = *(uchar *)((long)ctx->state + 0x2e);
  output[0x2a] = *(uchar *)((long)ctx->state + 0x2d);
  output[0x2b] = *(uchar *)((long)ctx->state + 0x2c);
  output[0x2c] = *(uchar *)((long)ctx->state + 0x2b);
  output[0x2d] = *(uchar *)((long)ctx->state + 0x2a);
  output[0x2e] = *(uchar *)((long)ctx->state + 0x29);
  output[0x2f] = (uchar)ctx->state[5];
  if (ctx->is384 == 0) {
    output[0x30] = *(uchar *)((long)ctx->state + 0x37);
    output[0x31] = *(uchar *)((long)ctx->state + 0x36);
    output[0x32] = *(uchar *)((long)ctx->state + 0x35);
    output[0x33] = *(uchar *)((long)ctx->state + 0x34);
    output[0x34] = *(uchar *)((long)ctx->state + 0x33);
    output[0x35] = *(uchar *)((long)ctx->state + 0x32);
    output[0x36] = *(uchar *)((long)ctx->state + 0x31);
    output[0x37] = (uchar)ctx->state[6];
    output[0x38] = *(uchar *)((long)ctx->state + 0x3f);
    output[0x39] = *(uchar *)((long)ctx->state + 0x3e);
    output[0x3a] = *(uchar *)((long)ctx->state + 0x3d);
    output[0x3b] = *(uchar *)((long)ctx->state + 0x3c);
    output[0x3c] = *(uchar *)((long)ctx->state + 0x3b);
    output[0x3d] = *(uchar *)((long)ctx->state + 0x3a);
    output[0x3e] = *(uchar *)((long)ctx->state + 0x39);
    output[0x3f] = (uchar)ctx->state[7];
  }
  return 0;
}

Assistant:

int mbedtls_sha512_finish_ret( mbedtls_sha512_context *ctx,
                               unsigned char output[64] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned used;
    uint64_t high, low;

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( (unsigned char *)output != NULL );

    /*
     * Add padding: 0x80 then 0x00 until 16 bytes remain for the length
     */
    used = ctx->total[0] & 0x7F;

    ctx->buffer[used++] = 0x80;

    if( used <= 112 )
    {
        /* Enough room for padding + length in current block */
        memset( ctx->buffer + used, 0, 112 - used );
    }
    else
    {
        /* We'll need an extra block */
        memset( ctx->buffer + used, 0, 128 - used );

        if( ( ret = mbedtls_internal_sha512_process( ctx, ctx->buffer ) ) != 0 )
            return( ret );

        memset( ctx->buffer, 0, 112 );
    }

    /*
     * Add message length
     */
    high = ( ctx->total[0] >> 61 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    sha512_put_uint64_be( high, ctx->buffer, 112 );
    sha512_put_uint64_be( low,  ctx->buffer, 120 );

    if( ( ret = mbedtls_internal_sha512_process( ctx, ctx->buffer ) ) != 0 )
        return( ret );

    /*
     * Output final state
     */
    sha512_put_uint64_be( ctx->state[0], output,  0 );
    sha512_put_uint64_be( ctx->state[1], output,  8 );
    sha512_put_uint64_be( ctx->state[2], output, 16 );
    sha512_put_uint64_be( ctx->state[3], output, 24 );
    sha512_put_uint64_be( ctx->state[4], output, 32 );
    sha512_put_uint64_be( ctx->state[5], output, 40 );

#if !defined(MBEDTLS_SHA512_NO_SHA384)
    if( ctx->is384 == 0 )
#endif
    {
        sha512_put_uint64_be( ctx->state[6], output, 48 );
        sha512_put_uint64_be( ctx->state[7], output, 56 );
    }

    return( 0 );
}